

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

void __thiscall duckdb::WindowLocalSourceState::Sink(WindowLocalSourceState *this)

{
  optional_ptr<duckdb::WindowHashGroup,_true> *this_00;
  idx_t *piVar1;
  atomic<unsigned_long> *paVar2;
  WindowHashGroup *pWVar3;
  ulong uVar4;
  pointer pvVar5;
  optional_ptr<duckdb::WindowHashGroup,_true> block_idx;
  unsigned_long *input_idx;
  idx_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ExecutorGlobalStates *this_01;
  const_reference pvVar10;
  pointer pWVar11;
  reference pvVar12;
  type pWVar13;
  pointer pRVar14;
  pointer pWVar15;
  WindowBuilder *this_02;
  reference this_03;
  type pWVar16;
  ulong uVar17;
  size_type sVar18;
  pointer *__ptr;
  WindowGlobalSinkState *gsink;
  unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
  *this_04;
  _Head_base<0UL,_duckdb::RowDataCollection_*,_false> result;
  undefined1 local_b8 [120];
  WindowGlobalSinkState *local_40;
  unsigned_long *local_38;
  
  gsink = this->gsource->gsink;
  this_00 = &this->window_hash_group;
  optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid(this_00);
  this_01 = WindowHashGroup::Initialize((this->window_hash_group).ptr,gsink);
  local_b8._24_8_ = this_00;
  optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid(this_00);
  pWVar3 = (this->window_hash_group).ptr;
  local_b8._8_8_ = &this->task;
  optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid
            ((optional_ptr<duckdb::WindowSourceTask,_true> *)local_b8._8_8_);
  uVar4 = ((this->task).ptr)->thread_idx;
  pvVar5 = (pWVar3->thread_states).
           super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
           .
           super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar17 = ((long)(pWVar3->thread_states).
                  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
                  .
                  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
           -0x5555555555555555;
  if (uVar17 < uVar4 || uVar17 - uVar4 == 0) {
    ::std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  local_b8._48_8_ = &gsink->executors;
  local_b8._64_8_ = pvVar5 + uVar4;
  if ((*(pointer *)local_b8._64_8_ == *(pointer *)(local_b8._64_8_ + 8)) &&
     ((gsink->executors).
      super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (gsink->executors).
      super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    sVar18 = 0;
    do {
      pvVar10 = vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_true>
                              *)local_b8._48_8_,sVar18);
      pWVar11 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
                ::operator->(pvVar10);
      pvVar12 = vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
                ::operator[](this_01,sVar18);
      pWVar13 = unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>
                ::operator*(pvVar12);
      (*pWVar11->_vptr_WindowExecutor[3])(local_b8,pWVar11,pWVar13);
      ::std::
      vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>>>
                  *)local_b8._64_8_,
                 (unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>
                  *)local_b8);
      if ((pointer)local_b8._0_8_ != (pointer)0x0) {
        (*(code *)((RowDataCollection *)
                  ((WindowExecutorState *)local_b8._0_8_)->_vptr_WindowExecutorState)->count)();
      }
      sVar18 = sVar18 + 1;
    } while (sVar18 < (ulong)((long)(gsink->executors).
                                    super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(gsink->executors).
                                    super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  uVar7 = local_b8._8_8_;
  optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid
            ((optional_ptr<duckdb::WindowSourceTask,_true> *)local_b8._8_8_);
  uVar4 = (*(WindowSourceTask **)uVar7)->begin_idx;
  optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid
            ((optional_ptr<duckdb::WindowSourceTask,_true> *)uVar7);
  if (uVar4 < (*(WindowSourceTask **)uVar7)->end_idx) {
    local_b8._16_8_ = &this->scanner;
    local_b8._40_8_ = &this->input_chunk;
    local_b8._32_8_ = &this->coll_chunk;
    local_b8._96_8_ = &this->coll_exec;
    local_b8._88_8_ = &this->builder;
    local_b8._72_8_ = &this->sink_chunk;
    local_b8._80_8_ = &this->sink_exec;
    local_b8._104_8_ = this_01;
    local_b8._112_8_ = this;
    local_40 = gsink;
    do {
      uVar7 = local_b8._24_8_;
      this_04 = (unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                 *)local_b8._16_8_;
      optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid
                ((optional_ptr<duckdb::WindowHashGroup,_true> *)local_b8._24_8_);
      block_idx.ptr = *(WindowHashGroup **)uVar7;
      optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid
                ((optional_ptr<duckdb::WindowSourceTask,_true> *)local_b8._8_8_);
      WindowHashGroup::GetBuildScanner((WindowHashGroup *)local_b8,(idx_t)block_idx.ptr);
      uVar7 = local_b8._0_8_;
      local_b8._0_8_ = (_Head_base<0UL,_duckdb::WindowExecutorLocalState_*,_false>)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      ::reset((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
               *)this_04,(pointer)uVar7);
      uVar7 = local_b8._0_8_;
      if ((__uniq_ptr_impl<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>_>
           )local_b8._0_8_ !=
          (__uniq_ptr_impl<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>_>
           )0x0) {
        RowDataCollectionScanner::~RowDataCollectionScanner
                  ((RowDataCollectionScanner *)local_b8._0_8_);
        operator_delete((void *)uVar7);
      }
      if ((this_04->
          super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl ==
          (RowDataCollectionScanner *)0x0) {
        return;
      }
      while( true ) {
        pRVar14 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                  ::operator->(this_04);
        uVar7 = local_b8._40_8_;
        input_idx = (unsigned_long *)pRVar14->total_scanned;
        DataChunk::Reset((DataChunk *)local_b8._40_8_);
        pRVar14 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                  ::operator->(this_04);
        RowDataCollectionScanner::Scan(pRVar14,(DataChunk *)uVar7);
        result._M_head_impl = (RowDataCollection *)local_b8._32_8_;
        iVar6 = (this->input_chunk).count;
        if (iVar6 == 0) break;
        if ((this->coll_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->coll_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          (this->coll_chunk).count = iVar6;
        }
        else {
          DataChunk::Reset((DataChunk *)local_b8._32_8_);
          ExpressionExecutor::Execute
                    ((ExpressionExecutor *)local_b8._96_8_,(DataChunk *)uVar7,
                     (DataChunk *)result._M_head_impl);
          uVar8 = local_b8._24_8_;
          optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid
                    ((optional_ptr<duckdb::WindowHashGroup,_true> *)local_b8._24_8_);
          uVar9 = local_b8._88_8_;
          local_b8._56_8_ =
               ((*(WindowHashGroup **)uVar8)->collection).
               super_unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
               .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl;
          if (((((unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_> *)
                local_b8._88_8_)->_M_t).
               super___uniq_ptr_impl<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::WindowBuilder_*,_std::default_delete<duckdb::WindowBuilder>_>
               .super__Head_base<0UL,_duckdb::WindowBuilder_*,_false>._M_head_impl ==
               (WindowBuilder *)0x0) ||
             (pWVar15 = unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>,_true>
                        ::operator->((unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>,_true>
                                      *)local_b8._88_8_),
             pWVar15->collection != (WindowCollection *)local_b8._56_8_)) {
            this_02 = (WindowBuilder *)operator_new(0x78);
            WindowBuilder::WindowBuilder(this_02,(WindowCollection *)local_b8._56_8_);
            ::std::
            __uniq_ptr_impl<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>::
            reset((__uniq_ptr_impl<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>
                   *)uVar9,this_02);
            result._M_head_impl = (RowDataCollection *)local_b8._32_8_;
          }
          pWVar15 = unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>,_true>
                    ::operator->((unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>,_true>
                                  *)uVar9);
          WindowBuilder::Sink(pWVar15,(DataChunk *)result._M_head_impl,(idx_t)input_idx);
        }
        uVar8 = local_b8._72_8_;
        if ((this->sink_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->sink_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          (this->sink_chunk).count = (this->input_chunk).count;
        }
        else {
          DataChunk::Reset((DataChunk *)local_b8._72_8_);
          ExpressionExecutor::Execute
                    ((ExpressionExecutor *)local_b8._80_8_,(DataChunk *)uVar7,(DataChunk *)uVar8);
        }
        uVar9 = local_b8._104_8_;
        uVar8 = local_b8._48_8_;
        uVar7 = local_b8._32_8_;
        local_38 = input_idx;
        if ((gsink->executors).
            super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (gsink->executors).
            super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          sVar18 = 0;
          do {
            pvVar10 = vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_true>
                                    *)uVar8,sVar18);
            pWVar11 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
                      ::operator->(pvVar10);
            pvVar12 = vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
                                    *)uVar9,sVar18);
            pWVar13 = unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>
                      ::operator*(pvVar12);
            this_03 = vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>
                                    *)local_b8._64_8_,sVar18);
            pWVar16 = unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>
                      ::operator*(this_03);
            gsink = local_40;
            (*pWVar11->_vptr_WindowExecutor[4])
                      (pWVar11,local_b8._72_8_,uVar7,local_38,pWVar13,pWVar16);
            sVar18 = sVar18 + 1;
          } while (sVar18 < (ulong)((long)(gsink->executors).
                                          super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(gsink->executors).
                                          super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        this = (WindowLocalSourceState *)local_b8._112_8_;
        iVar6 = ((DataChunk *)(local_b8._112_8_ + 0x30))->count;
        optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid
                  ((optional_ptr<duckdb::WindowHashGroup,_true> *)local_b8._24_8_);
        LOCK();
        paVar2 = &((optional_ptr<duckdb::WindowHashGroup,_true> *)((long)this + 0x20))->ptr->sunk;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i + iVar6;
        UNLOCK();
        this_04 = (unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                   *)local_b8._16_8_;
      }
      pRVar14 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                ::operator->(this_04);
      uVar7 = local_b8._8_8_;
      optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid
                ((optional_ptr<duckdb::WindowSourceTask,_true> *)local_b8._8_8_);
      RowDataCollectionScanner::SwizzleBlock(pRVar14,(*(WindowSourceTask **)uVar7)->begin_idx);
      ::std::
      __uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      ::reset((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
               *)local_b8._16_8_,(pointer)0x0);
      optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid
                ((optional_ptr<duckdb::WindowSourceTask,_true> *)uVar7);
      piVar1 = &(*(WindowSourceTask **)uVar7)->begin_idx;
      *piVar1 = *piVar1 + 1;
      optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid
                ((optional_ptr<duckdb::WindowSourceTask,_true> *)uVar7);
      uVar4 = (*(WindowSourceTask **)uVar7)->begin_idx;
      optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid
                ((optional_ptr<duckdb::WindowSourceTask,_true> *)uVar7);
    } while (uVar4 < (*(WindowSourceTask **)uVar7)->end_idx);
  }
  return;
}

Assistant:

void WindowLocalSourceState::Sink() {
	D_ASSERT(task);
	D_ASSERT(task->stage == WindowGroupStage::SINK);

	auto &gsink = gsource.gsink;
	const auto &executors = gsink.executors;

	// Create the global state for each function
	// These can be large so we defer building them until we are ready.
	auto &gestates = window_hash_group->Initialize(gsink);

	//	Set up the local states
	auto &local_states = window_hash_group->thread_states.at(task->thread_idx);
	if (local_states.empty()) {
		for (idx_t w = 0; w < executors.size(); ++w) {
			local_states.emplace_back(executors[w]->GetLocalState(*gestates[w]));
		}
	}

	//	First pass over the input without flushing
	for (; task->begin_idx < task->end_idx; ++task->begin_idx) {
		scanner = window_hash_group->GetBuildScanner(task->begin_idx);
		if (!scanner) {
			break;
		}
		while (true) {
			//	TODO: Try to align on validity mask boundaries by starting ragged?
			idx_t input_idx = scanner->Scanned();
			input_chunk.Reset();
			scanner->Scan(input_chunk);
			if (input_chunk.size() == 0) {
				break;
			}

			//	Compute fully materialised expressions
			if (coll_chunk.data.empty()) {
				coll_chunk.SetCardinality(input_chunk);
			} else {
				coll_chunk.Reset();
				coll_exec.Execute(input_chunk, coll_chunk);
				auto collection = window_hash_group->collection.get();
				if (!builder || &builder->collection != collection) {
					builder = make_uniq<WindowBuilder>(*collection);
				}

				builder->Sink(coll_chunk, input_idx);
			}

			// Compute sink expressions
			if (sink_chunk.data.empty()) {
				sink_chunk.SetCardinality(input_chunk);
			} else {
				sink_chunk.Reset();
				sink_exec.Execute(input_chunk, sink_chunk);
			}

			for (idx_t w = 0; w < executors.size(); ++w) {
				executors[w]->Sink(sink_chunk, coll_chunk, input_idx, *gestates[w], *local_states[w]);
			}

			window_hash_group->sunk += input_chunk.size();
		}

		// External scanning assumes all blocks are swizzled.
		scanner->SwizzleBlock(task->begin_idx);
		scanner.reset();
	}
}